

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vicv.cpp
# Opt level: O0

void __thiscall E64::vicv_ic::vicv_ic(vicv_ic *this)

{
  vicv_ic *in_RDI;
  
  in_RDI->disk_stat_visible = true;
  in_RDI->stats_visible = false;
  in_RDI->fb0 = (uint16_t *)((machine.mmu)->ram + 0xf00000);
  in_RDI->fb1 = (uint16_t *)((machine.mmu)->ram + 0xf48000);
  in_RDI->breakpoint_reached = false;
  clear_scanline_breakpoints(in_RDI);
  in_RDI->old_y_pos = 0;
  in_RDI->stats_text = (char *)0x0;
  return;
}

Assistant:

E64::vicv_ic::vicv_ic()
{
	disk_stat_visible = true;
	stats_visible = false;

	fb0 = (uint16_t *)&machine.mmu->ram[VICV_FB0];
	fb1 = (uint16_t *)&machine.mmu->ram[VICV_FB1];

	breakpoint_reached = false;
	clear_scanline_breakpoints();
	old_y_pos = 0;

	stats_text = nullptr;
}